

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossy.c
# Opt level: O2

void test_even(void)

{
  size_t cnt;
  long lVar1;
  uint64_t uVar2;
  int iVar3;
  quicly_cid_plaintext_t *pqVar4;
  bool bVar5;
  undefined8 uStackY_1a0;
  ptls_iovec_t pStackY_198;
  size_t sStack_180;
  undefined1 auStack_178 [8];
  uint8_t *local_170;
  size_t num_sent;
  undefined1 local_e4 [8];
  quicly_address_t srcaddr;
  undefined8 uStack_c0;
  undefined1 local_b0 [8];
  iovec raw;
  size_t num_packets;
  size_t num_received;
  undefined1 local_78 [8];
  loss_cond_t cond_down;
  
  uVar2 = quic_ctx.transport_params.max_udp_payload_size;
  quic_ctx.loss.time_reordering_percentile = 0x80;
  quic_ctx.loss.min_pto = 1;
  quic_ctx.loss.default_initial_rtt = 0x42;
  quic_ctx.loss.num_speculative_ptos = '\0';
  quic_ctx.loss._13_3_ = 0;
  local_78 = (undefined1  [8])cond_even_;
  cond_down.data.rand_.bits = 0;
  cond_down.cb = (_func_int_loss_cond_t_ptr *)0x0;
  cond_down.data.even.cnt = (anon_struct_8_1_ba1d3cc9_for_even)0;
  cond_down.data.rand_.bits_avail = (size_t)cond_even_;
  sStack_180 = 1;
  quic_now = 1;
  lVar1 = -(quic_ctx.transport_params.max_udp_payload_size + 0xf & 0xfffffffffffffff0);
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x1158a7;
  pqVar4 = new_master_id();
  srcaddr._20_8_ = 0;
  uStack_c0 = 0;
  *(undefined8 *)((long)&pStackY_198 + lVar1) = 0;
  *(undefined8 *)((long)&pStackY_198 + lVar1 + 8) = 0;
  *(undefined8 *)(&stack0xfffffffffffffe78 + lVar1) = 0;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0;
  *(undefined8 *)((long)&uStackY_1a0 + lVar1) = 0x1158e1;
  iVar3 = quicly_connect(&client,&quic_ctx,"example.com",&fake_address.sa,(sockaddr *)0x0,pqVar4,
                         *(ptls_iovec_t *)((long)&pStackY_198 + lVar1),
                         *(ptls_handshake_properties_t **)(&stack0xfffffffffffffe78 + lVar1),
                         *(quicly_transport_parameters_t **)(auStack_178 + lVar1 + -8));
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11590d;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb4)
  ;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 1;
  raw.iov_len = *(size_t *)(auStack_178 + lVar1 + -8);
  *(uint64_t *)(&stack0xfffffffffffffe78 + lVar1) = uVar2;
  *(undefined8 *)((long)&pStackY_198 + lVar1 + 8) = 0x115947;
  iVar3 = quicly_send(client,(quicly_address_t *)&num_packets,(quicly_address_t *)local_e4,
                      (iovec *)local_b0,&raw.iov_len,auStack_178 + lVar1,
                      *(size_t *)(&stack0xfffffffffffffe78 + lVar1));
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x115965;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb7)
  ;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 1;
  cnt = *(size_t *)(auStack_178 + lVar1 + -8);
  bVar5 = raw.iov_len == cnt;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x115984;
  _ok((uint)bVar5,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xb8)
  ;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x11599d;
  decode_packets((quicly_decoded_packet_t *)&stack0xfffffffffffffe90,(iovec *)local_b0,cnt);
  bVar5 = raw.iov_len == cnt;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x1159b8;
  _ok((uint)bVar5,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xba)
  ;
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x1159bd;
  pqVar4 = new_master_id();
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0;
  *(quicly_cid_plaintext_t **)(&stack0xfffffffffffffe78 + lVar1) = pqVar4;
  *(undefined8 *)((long)&pStackY_198 + lVar1 + 8) = 0x1159e2;
  iVar3 = quicly_accept(&server,&quic_ctx,(sockaddr *)0x0,&fake_address.sa,
                        (quicly_decoded_packet_t *)&stack0xfffffffffffffe90,
                        (quicly_address_token_plaintext_t *)0x0,
                        *(quicly_cid_plaintext_t **)(&stack0xfffffffffffffe78 + lVar1),
                        *(ptls_handshake_properties_t **)(auStack_178 + lVar1 + -8));
  *(undefined8 *)(auStack_178 + lVar1 + -8) = 0x115a00;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xbc)
  ;
  pStackY_198.len = 0x115a43;
  iVar3 = transmit_cond(server,client,(size_t *)&stack0xfffffffffffffe90,&num_packets,
                        (loss_cond_t *)local_78,0,(ptls_buffer_t *)0x0);
  sStack_180 = 0x115a61;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc2)
  ;
  sStack_180 = 0x115a7d;
  _ok((uint)(local_170 == (uint8_t *)0x2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc3)
  ;
  sStack_180 = 0x115a98;
  _ok((uint)(num_packets == cnt),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc4)
  ;
  sStack_180 = 0x115abb;
  _ok((uint)((client->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc5)
  ;
  sStack_180 = 0x115ac7;
  iVar3 = quicly_connection_is_ready(client);
  sStack_180 = 0x115ae1;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xc6)
  ;
  quic_now = quic_now + 0x19;
  pStackY_198.len = 0x115b13;
  iVar3 = transmit_cond(client,server,(size_t *)&stack0xfffffffffffffe90,&num_packets,
                        (loss_cond_t *)((long)&cond_down.data + 0x10),0,(ptls_buffer_t *)0x0);
  sStack_180 = 0x115b31;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xcc)
  ;
  sStack_180 = 0x115b4f;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xcd)
  ;
  sStack_180 = 0x115b6c;
  _ok((uint)(num_packets == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xce)
  ;
  sStack_180 = 0x115b8f;
  _ok((uint)((client->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd0)
  ;
  sStack_180 = 0x115b9b;
  iVar3 = quicly_connection_is_ready(client);
  sStack_180 = 0x115bb5;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd1)
  ;
  quic_now = quic_now + 1000;
  pStackY_198.len = 0x115be4;
  iVar3 = transmit_cond(server,client,(size_t *)&stack0xfffffffffffffe90,&num_packets,
                        (loss_cond_t *)local_78,0,(ptls_buffer_t *)0x0);
  sStack_180 = 0x115c02;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd7)
  ;
  sStack_180 = 0x115c1e;
  _ok((uint)(local_170 == (uint8_t *)0x2),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd8)
  ;
  sStack_180 = 0x115c40;
  _ok((uint)(num_packets == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xd9)
  ;
  sStack_180 = 0x115c63;
  _ok((uint)((client->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xda)
  ;
  sStack_180 = 0x115c6f;
  iVar3 = quicly_connection_is_ready(client);
  sStack_180 = 0x115c89;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xdb)
  ;
  quic_now = quic_now + 0x19;
  pStackY_198.len = 0x115cba;
  iVar3 = transmit_cond(client,server,(size_t *)&stack0xfffffffffffffe90,&num_packets,
                        (loss_cond_t *)((long)&cond_down.data + 0x10),0,(ptls_buffer_t *)0x0);
  sStack_180 = 0x115cd8;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe1)
  ;
  sStack_180 = 0x115cf7;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe2)
  ;
  sStack_180 = 0x115d16;
  _ok((uint)(num_packets == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe3)
  ;
  quic_now = quic_now + 1000;
  pStackY_198.len = 0x115d55;
  iVar3 = transmit_cond(server,client,(size_t *)&stack0xfffffffffffffe90,&num_packets,
                        (loss_cond_t *)local_78,0,(ptls_buffer_t *)0x0);
  sStack_180 = 0x115d73;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xe9)
  ;
  sStack_180 = 0x115d8e;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xea)
  ;
  sStack_180 = 0x115da9;
  _ok((uint)(num_packets == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xeb)
  ;
  sStack_180 = 0x115dcc;
  _ok((uint)((client->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xed)
  ;
  sStack_180 = 0x115dd8;
  iVar3 = quicly_connection_is_ready(client);
  sStack_180 = 0x115dec;
  _ok(iVar3,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xee)
  ;
  pStackY_198.len = 0x115e12;
  iVar3 = transmit_cond(client,server,(size_t *)&stack0xfffffffffffffe90,&num_packets,
                        (loss_cond_t *)((long)&cond_down.data + 0x10),0,(ptls_buffer_t *)0x0);
  sStack_180 = 0x115e30;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf2)
  ;
  sStack_180 = 0x115e4b;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf3)
  ;
  sStack_180 = 0x115e68;
  _ok((uint)(num_packets == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xf4)
  ;
  quic_now = quic_now + 1000;
  pStackY_198.len = 0x115e9d;
  iVar3 = transmit_cond(server,client,(size_t *)&stack0xfffffffffffffe90,&num_packets,
                        (loss_cond_t *)local_78,0,(ptls_buffer_t *)0x0);
  sStack_180 = 0x115ebb;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfa)
  ;
  sStack_180 = 0x115eda;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfb)
  ;
  sStack_180 = 0x115ef7;
  _ok((uint)(num_packets == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0xfc)
  ;
  quic_now = quic_now + 1000;
  pStackY_198.len = 0x115f2c;
  iVar3 = transmit_cond(client,server,(size_t *)&stack0xfffffffffffffe90,&num_packets,
                        (loss_cond_t *)((long)&cond_down.data + 0x10),0,(ptls_buffer_t *)0x0);
  sStack_180 = 0x115f4a;
  _ok((uint)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x102
     );
  sStack_180 = 0x115f65;
  _ok((uint)(local_170 == (uint8_t *)0x1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x103
     );
  sStack_180 = 0x115f87;
  _ok((uint)(num_packets == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x104
     );
  sStack_180 = 0x115faa;
  _ok((uint)((server->super).state == QUICLY_STATE_CONNECTED),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x106
     );
  sStack_180 = 0x115fb6;
  iVar3 = quicly_connection_is_ready(server);
  sStack_180 = 0x115fca;
  _ok(iVar3,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/lossy.c",0x107
     );
  quic_ctx.loss.time_reordering_percentile = 0x80;
  quic_ctx.loss.min_pto = 1;
  quic_ctx.loss.default_initial_rtt = 0x42;
  quic_ctx.loss.num_speculative_ptos = '\0';
  return;
}

Assistant:

static void test_even(void)
{
    quicly_loss_conf_t lossconf = QUICLY_LOSS_SPEC_CONF;
    struct loss_cond_t cond_down, cond_up;
    size_t num_sent, num_received;
    int ret;

    quic_ctx.loss = lossconf;
    init_cond_even(&cond_down);
    init_cond_even(&cond_up);

    quic_now = 1;

    { /* transmit first flight */
        quicly_address_t destaddr, srcaddr;
        struct iovec raw;
        uint8_t rawbuf[quic_ctx.transport_params.max_udp_payload_size];
        size_t num_packets;
        quicly_decoded_packet_t decoded;

        ret = quicly_connect(&client, &quic_ctx, "example.com", &fake_address.sa, NULL, new_master_id(), ptls_iovec_init(NULL, 0),
                             NULL, NULL);
        ok(ret == 0);
        num_packets = 1;
        ret = quicly_send(client, &destaddr, &srcaddr, &raw, &num_packets, rawbuf, sizeof(rawbuf));
        ok(ret == 0);
        ok(num_packets == 1);
        decode_packets(&decoded, &raw, 1);
        ok(num_packets == 1);
        ret = quicly_accept(&server, &quic_ctx, NULL, &fake_address.sa, &decoded, NULL, new_master_id(), NULL);
        ok(ret == 0);
        cond_up.cb(&cond_up);
    }

    /* server sends 2 datagrams (Initial+Handshake,Handshake+1RTT), the latter gets dropped */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 2);
    ok(num_received == 1);
    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;

    /* client sends Handshake that gets dropped */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += 1000;

    /* server resends 2 datagrams, the latter gets dropped again */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 2);
    ok(num_received == 1);
    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(!quicly_connection_is_ready(client));

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;

    /* client sends Handshake again */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    quic_now += 1000;

    /* server retransmits the unacked (Handshake+1RTT) packet */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    ok(quicly_get_state(client) == QUICLY_STATE_CONNECTED);
    ok(quicly_connection_is_ready(client));

    /* client sends ClientFinished, gets lost */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    quic_now += 1000;

    /* server retransmits the unacked packet */
    ret = transmit_cond(server, client, &num_sent, &num_received, &cond_down, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 0);

    quic_now += 1000;

    /* client resends ClientFinished */
    ret = transmit_cond(client, server, &num_sent, &num_received, &cond_up, 0, NULL);
    ok(ret == 0);
    ok(num_sent == 1);
    ok(num_received == 1);

    ok(quicly_get_state(server) == QUICLY_STATE_CONNECTED);
    ok(quicly_connection_is_ready(server));

    quic_ctx.loss = (quicly_loss_conf_t)QUICLY_LOSS_SPEC_CONF;
}